

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator|=(my_set<unsigned_long> *this,my_set<unsigned_long> *b)

{
  my_set<unsigned_long> local_38;
  my_set<unsigned_long> *local_18;
  my_set<unsigned_long> *b_local;
  my_set<unsigned_long> *this_local;
  
  local_18 = b;
  b_local = this;
  operator|(&local_38,this,b);
  operator=(this,&local_38);
  ~my_set(&local_38);
  return this;
}

Assistant:

my_set<T>& my_set<T>::operator|=(const my_set<T>& b) {
	*this = *this | b;
	return *this;
}